

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_windows.c
# Opt level: O0

void keyboard(mfb_window *window,mfb_key key,mfb_key_mod mod,_Bool isPressed)

{
  FILE *__stream;
  char *pcVar1;
  byte in_CL;
  uint in_EDX;
  mfb_key in_ESI;
  mfb_window *in_RDI;
  char *window_title;
  char *local_20;
  
  local_20 = "";
  if (in_RDI != (mfb_window *)0x0) {
    local_20 = (char *)mfb_get_user_data(in_RDI);
  }
  __stream = _stdout;
  pcVar1 = mfb_get_key_name(in_ESI);
  fprintf(__stream,"%s > keyboard: key: %s (pressed: %d) [key_mod: %x]\n",local_20,pcVar1,
          (ulong)(in_CL & 1),(ulong)in_EDX);
  if (in_ESI == KB_KEY_ESCAPE) {
    mfb_close(in_RDI);
  }
  return;
}

Assistant:

void 
keyboard(struct mfb_window *window, mfb_key key, mfb_key_mod mod, bool isPressed) {
    const char *window_title = "";
    if(window) {
        window_title = (const char *) mfb_get_user_data(window);
    }
    fprintf(stdout, "%s > keyboard: key: %s (pressed: %d) [key_mod: %x]\n", window_title, mfb_get_key_name(key), isPressed, mod);
    if(key == KB_KEY_ESCAPE) {
        mfb_close(window);
    }    
}